

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_double_add_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *S,
                      mbedtls_ecp_point *P,mbedtls_ecp_point *Q,mbedtls_mpi *d)

{
  undefined1 local_118 [8];
  mbedtls_mpi CB;
  mbedtls_mpi DA;
  mbedtls_mpi D;
  mbedtls_mpi C;
  mbedtls_mpi E;
  mbedtls_mpi BB;
  mbedtls_mpi B;
  mbedtls_mpi AA;
  mbedtls_mpi A;
  int ret;
  mbedtls_mpi *d_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *S_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&AA.p);
  mbedtls_mpi_init((mbedtls_mpi *)&B.p);
  mbedtls_mpi_init((mbedtls_mpi *)&BB.p);
  mbedtls_mpi_init((mbedtls_mpi *)&E.p);
  mbedtls_mpi_init((mbedtls_mpi *)&C.p);
  mbedtls_mpi_init((mbedtls_mpi *)&D.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DA.p);
  mbedtls_mpi_init((mbedtls_mpi *)&CB.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_118);
  A.p._4_4_ = mbedtls_mpi_add_mod(grp,(mbedtls_mpi *)&AA.p,&P->X,&P->Z);
  if ((((((A.p._4_4_ == 0) &&
         (A.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&B.p,(mbedtls_mpi *)&AA.p,
                                          (mbedtls_mpi *)&AA.p), A.p._4_4_ == 0)) &&
        (A.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&BB.p,&P->X,&P->Z), A.p._4_4_ == 0)) &&
       (((A.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&E.p,(mbedtls_mpi *)&BB.p,
                                          (mbedtls_mpi *)&BB.p), A.p._4_4_ == 0 &&
         (A.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&C.p,(mbedtls_mpi *)&B.p,
                                          (mbedtls_mpi *)&E.p), A.p._4_4_ == 0)) &&
        ((A.p._4_4_ = mbedtls_mpi_add_mod(grp,(mbedtls_mpi *)&D.p,&Q->X,&Q->Z), A.p._4_4_ == 0 &&
         ((A.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&DA.p,&Q->X,&Q->Z), A.p._4_4_ == 0 &&
          (A.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&CB.p,(mbedtls_mpi *)&DA.p,
                                           (mbedtls_mpi *)&AA.p), A.p._4_4_ == 0)))))))) &&
      (A.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_118,(mbedtls_mpi *)&D.p,
                                       (mbedtls_mpi *)&BB.p), A.p._4_4_ == 0)) &&
     ((A.p._4_4_ = mbedtls_mpi_add_mpi(&S->X,(mbedtls_mpi *)&CB.p,(mbedtls_mpi *)local_118),
      A.p._4_4_ == 0 && (A.p._4_4_ = ecp_modp(&S->X,grp), A.p._4_4_ == 0)))) {
    mul_count = mul_count + 1;
    A.p._4_4_ = mbedtls_mpi_mul_mod(grp,&S->X,&S->X,&S->X);
    if (((A.p._4_4_ == 0) &&
        ((((A.p._4_4_ = mbedtls_mpi_sub_mod(grp,&S->Z,(mbedtls_mpi *)&CB.p,(mbedtls_mpi *)local_118)
           , A.p._4_4_ == 0 &&
           (A.p._4_4_ = mbedtls_mpi_mul_mod(grp,&S->Z,&S->Z,&S->Z), A.p._4_4_ == 0)) &&
          (A.p._4_4_ = mbedtls_mpi_mul_mod(grp,&S->Z,d,&S->Z), A.p._4_4_ == 0)) &&
         ((A.p._4_4_ = mbedtls_mpi_mul_mod(grp,&R->X,(mbedtls_mpi *)&B.p,(mbedtls_mpi *)&E.p),
          A.p._4_4_ == 0 &&
          (A.p._4_4_ = mbedtls_mpi_mul_mod(grp,&R->Z,&grp->A,(mbedtls_mpi *)&C.p), A.p._4_4_ == 0)))
         ))) && (A.p._4_4_ = mbedtls_mpi_add_mod(grp,&R->Z,(mbedtls_mpi *)&E.p,&R->Z),
                A.p._4_4_ == 0)) {
      A.p._4_4_ = mbedtls_mpi_mul_mod(grp,&R->Z,(mbedtls_mpi *)&C.p,&R->Z);
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)&AA.p);
  mbedtls_mpi_free((mbedtls_mpi *)&B.p);
  mbedtls_mpi_free((mbedtls_mpi *)&BB.p);
  mbedtls_mpi_free((mbedtls_mpi *)&E.p);
  mbedtls_mpi_free((mbedtls_mpi *)&C.p);
  mbedtls_mpi_free((mbedtls_mpi *)&D.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DA.p);
  mbedtls_mpi_free((mbedtls_mpi *)&CB.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_118);
  return A.p._4_4_;
}

Assistant:

static int ecp_double_add_mxz( const mbedtls_ecp_group *grp,
                               mbedtls_ecp_point *R, mbedtls_ecp_point *S,
                               const mbedtls_ecp_point *P, const mbedtls_ecp_point *Q,
                               const mbedtls_mpi *d )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi A, AA, B, BB, E, C, D, DA, CB;

#if defined(MBEDTLS_ECP_DOUBLE_ADD_MXZ_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_double_add_mxz( grp, R, S, P, Q, d ) );
#endif /* MBEDTLS_ECP_DOUBLE_ADD_MXZ_ALT */

    mbedtls_mpi_init( &A ); mbedtls_mpi_init( &AA ); mbedtls_mpi_init( &B );
    mbedtls_mpi_init( &BB ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &C );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &DA ); mbedtls_mpi_init( &CB );

    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &A,    &P->X,   &P->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &AA,   &A,      &A    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &B,    &P->X,   &P->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &BB,   &B,      &B    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &E,    &AA,     &BB   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &C,    &Q->X,   &Q->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &D,    &Q->X,   &Q->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &DA,   &D,      &A    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &CB,   &C,      &B    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &S->X, &DA,     &CB   ) ); MOD_MUL( S->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S->X, &S->X,   &S->X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &S->Z, &DA,     &CB   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S->Z, &S->Z,   &S->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S->Z, d,       &S->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &R->X, &AA,     &BB   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &R->Z, &grp->A, &E    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &R->Z, &BB,     &R->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &R->Z, &E,      &R->Z ) );

cleanup:
    mbedtls_mpi_free( &A ); mbedtls_mpi_free( &AA ); mbedtls_mpi_free( &B );
    mbedtls_mpi_free( &BB ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &C );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &DA ); mbedtls_mpi_free( &CB );

    return( ret );
}